

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

void __thiscall Diligent::DescriptorPoolManager::~DescriptorPoolManager(DescriptorPoolManager *this)

{
  undefined *puVar1;
  __int_type _Var2;
  Char *Message;
  undefined8 uVar3;
  char (*in_R9) [9];
  size_type local_58;
  undefined1 local_50 [8];
  string _msg;
  string msg;
  DescriptorPoolManager *this_local;
  
  _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->m_AllocatedPoolCounter);
  if (_Var2 != 0) {
    FormatString<char[68]>
              ((string *)((long)&_msg.field_2 + 8),
               (char (*) [68])"Not all allocated descriptor pools are returned to the pool manager")
    ;
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"~DescriptorPoolManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
               ,0x66);
    std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
  }
  local_58 = std::
             deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
             ::size(&this->m_Pools);
  FormatString<std::__cxx11::string,char[19],unsigned_long,char[9]>
            ((string *)local_50,(Diligent *)&this->m_PoolName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             " stats: allocated ",(char (*) [19])&local_58,(unsigned_long *)" pool(s)",in_R9);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(0,uVar3,0);
  }
  std::__cxx11::string::~string((string *)local_50);
  std::
  deque<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::~deque(&this->m_Pools);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~vector
            (&this->m_PoolSizes);
  std::__cxx11::string::~string((string *)&this->m_PoolName);
  return;
}

Assistant:

DescriptorPoolManager::~DescriptorPoolManager()
{
    DEV_CHECK_ERR(m_AllocatedPoolCounter == 0, "Not all allocated descriptor pools are returned to the pool manager");
    LOG_INFO_MESSAGE(m_PoolName, " stats: allocated ", m_Pools.size(), " pool(s)");
}